

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCEtriangleShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtCEtriangleShape::localGetSupportingVertexWithoutMargin(cbtCEtriangleShape *this,cbtVector3 *vec0)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_00001484 [12];
  cbtVector3 cVar15;
  cbtVector3 cVar16;
  
  fVar1 = vec0->m_floats[1];
  cVar2 = vec0->m_floats[0];
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])this->p1->m_data);
  uVar10 = auVar4._0_8_;
  auVar12._0_4_ = (float)this->p1->m_data[2];
  auVar12._4_12_ = in_ZMM1._4_12_;
  auVar5 = vmovshdup_avx(auVar4);
  cVar3 = vec0->m_floats[2];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * auVar5._0_4_)),ZEXT416((uint)cVar2),auVar4);
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)cVar3),auVar12);
  uVar6 = SUB128(ZEXT812(0),4);
  if (-1e+18 < auVar4._0_4_) {
    auVar7._4_8_ = uVar6;
    auVar7._0_4_ = auVar12._0_4_;
    uVar11 = auVar7._0_8_;
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
  }
  auVar5 = vmaxss_avx(auVar4,SUB6416(ZEXT464(0xdd5e0b6b),0));
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])this->p2->m_data);
  auVar14._0_4_ = (float)this->p2->m_data[2];
  auVar14._4_12_ = in_ZMM8._4_12_;
  auVar12 = vmovshdup_avx(auVar4);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar1)),ZEXT416((uint)cVar2),auVar4);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar3),auVar14);
  if (auVar5._0_4_ < auVar12._0_4_) {
    auVar8._4_8_ = uVar6;
    auVar8._0_4_ = auVar14._0_4_;
    uVar11 = auVar8._0_8_;
    uVar10 = auVar4._0_8_;
  }
  auVar5 = vmaxss_avx(auVar12,auVar5);
  auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])this->p3->m_data);
  auVar13._0_4_ = (float)this->p3->m_data[2];
  auVar13._4_12_ = in_register_00001484;
  auVar12 = vmovshdup_avx(auVar4);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)cVar2),auVar4,ZEXT416((uint)(auVar12._0_4_ * fVar1)));
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)cVar3),auVar13,auVar12);
  if (auVar5._0_4_ < auVar12._0_4_) {
    auVar9._4_8_ = uVar6;
    auVar9._0_4_ = auVar13._0_4_;
    cVar16.m_floats._0_8_ = auVar4._0_8_;
    cVar16.m_floats._8_8_ = auVar9._0_8_;
    return (cbtVector3)cVar16.m_floats;
  }
  cVar15.m_floats[2] = (cbtScalar)(int)uVar11;
  cVar15.m_floats[3] = (cbtScalar)(int)((ulong)uVar11 >> 0x20);
  cVar15.m_floats[0] = (cbtScalar)(int)uVar10;
  cVar15.m_floats[1] = (cbtScalar)(int)((ulong)uVar10 >> 0x20);
  return (cbtVector3)cVar15.m_floats;
}

Assistant:

cbtVector3	cbtCEtriangleShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
    cbtVector3 supVec(cbtScalar(0.),cbtScalar(0.),cbtScalar(0.));
	cbtScalar newDot,maxDot = cbtScalar(-BT_LARGE_FLOAT);
    cbtVector3 vtx;
	vtx = cbtVector3((cbtScalar)this->p1->x(),(cbtScalar)this->p1->y(),(cbtScalar)this->p1->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}
    vtx = cbtVector3((cbtScalar)this->p2->x(),(cbtScalar)this->p2->y(),(cbtScalar)this->p2->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}
    vtx = cbtVector3((cbtScalar)this->p3->x(),(cbtScalar)this->p3->y(),(cbtScalar)this->p3->z());
	newDot = vec0.dot(vtx);
	if (newDot > maxDot){
			maxDot = newDot;
			supVec = vtx;
	}

	return supVec;  //+ vec0.normalized()*this->sphereswept_rad; //***TODO*** add the sphereswept_rad layer (but gives seldom jittering.. why?)
}